

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O2

void __thiscall
VSInterface::VSInDelegator::Read
          (VSInDelegator *this,char *name,vector<bool,_std::allocator<bool>_> *output)

{
  int iVar1;
  int64_t iVar2;
  int i;
  int iVar3;
  
  iVar1 = (*this->_vsapi->propNumElements)(this->_in,name);
  if (-1 < iVar1) {
    *(undefined8 *)(output + 0x10) = *(undefined8 *)output;
    *(undefined4 *)(output + 0x18) = 0;
    for (iVar3 = 0; iVar1 != iVar3; iVar3 = iVar3 + 1) {
      iVar2 = (*this->_vsapi->propGetInt)(this->_in,name,iVar3,&this->_err);
      std::vector<bool,_std::allocator<bool>_>::push_back(output,iVar2 != 0);
    }
  }
  return;
}

Assistant:

void Read(const char* name, std::vector<bool>& output) override {
      auto size = _vsapi->propNumElements(_in, name);
      if (size < 0) return;
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(_vsapi->propGetInt(_in, name, i, &_err));
    }